

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_context.cpp
# Opt level: O2

void __thiscall Clasp::SharedContext::~SharedContext(SharedContext *this)

{
  Solver *this_00;
  Minimize *this_01;
  size_type sVar1;
  
  sVar1 = (this->solvers_).ebo_.size;
  while (sVar1 != 0) {
    this_00 = (this->solvers_).ebo_.buf[sVar1 - 1];
    if (this_00 != (Solver *)0x0) {
      Solver::~Solver(this_00);
    }
    operator_delete(this_00);
    sVar1 = (this->solvers_).ebo_.size - 1;
    (this->solvers_).ebo_.size = sVar1;
  }
  this_01 = this->mini_;
  if (this_01 != (Minimize *)0x0) {
    Minimize::~Minimize(this_01);
  }
  operator_delete(this_01);
  bk_lib::pod_vector<Clasp::Solver_*,_std::allocator<Clasp::Solver_*>_>::ebo::~ebo
            (&(this->solvers_).ebo_);
  SingleOwnerPtr<Clasp::Configuration,_Clasp::DeleteObject>::~SingleOwnerPtr(&this->config_);
  ShortImplicationsGraph::~ShortImplicationsGraph(&this->btig_);
  bk_lib::pod_vector<Clasp::VarInfo,_std::allocator<Clasp::VarInfo>_>::ebo::~ebo
            (&(this->varInfo_).ebo_);
  SingleOwnerPtr<Clasp::Distributor,_Clasp::DeleteObject>::~SingleOwnerPtr(&this->distributor);
  bk_lib::pod_vector<Clasp::DomainTable::ValueType,_std::allocator<Clasp::DomainTable::ValueType>_>
  ::ebo::~ebo(&(this->heuristic).entries_.ebo_);
  OutputTable::~OutputTable(&this->output);
  SingleOwnerPtr<Clasp::ExtDepGraph,_Clasp::DeleteObject>::~SingleOwnerPtr(&this->extGraph);
  SingleOwnerPtr<Clasp::Asp::PrgDepGraph,_Clasp::DeleteObject>::~SingleOwnerPtr(&this->sccGraph);
  SingleOwnerPtr<Clasp::SatPreprocessor,_Clasp::DeleteObject>::~SingleOwnerPtr(&this->satPrepro);
  return;
}

Assistant:

SharedContext::~SharedContext() {
	while (!solvers_.empty()) { delete solvers_.back(); solvers_.pop_back(); }
	delete mini_;
}